

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void __thiscall
ByteCodeGenerator::StartEmitCatch(ByteCodeGenerator *this,ParseNodeCatch *pnodeCatch)

{
  uint uVar1;
  ParseNode *this_00;
  ParseNodePtr patternNode;
  code *pcVar2;
  anon_class_24_3_b926b611 handler;
  Symbol *pSVar3;
  Scope *pSVar4;
  bool bVar5;
  byte bVar6;
  undefined4 *puVar7;
  ParseNodeParamPattern *pPVar8;
  ParseNodeName *pPVar9;
  ushort uVar10;
  Scope *local_30;
  Scope *scope;
  FuncInfo *funcInfo;
  
  if ((pnodeCatch->super_ParseNodeStmt).super_ParseNode.nop != knopCatch) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0xfa2,"(pnodeCatch->nop == knopCatch)","pnodeCatch->nop == knopCatch");
    if (!bVar5) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  local_30 = pnodeCatch->scope;
  scope = (Scope *)local_30->func;
  if (((((FuncInfo *)scope)->field_0xb4 & 6) != 0) || ((this->flags & 0x404) != 0)) {
    Scope::SetIsObject(local_30);
  }
  this_00 = pnodeCatch->pnodeParam;
  if (this_00 != (ParseNode *)0x0) {
    if (this_00->nop == knopParamPattern) {
      pPVar8 = ParseNode::AsParseNodeParamPattern(this_00);
      pSVar4 = local_30;
      patternNode = (pPVar8->super_ParseNodeUni).pnode1;
      pSVar3 = scope[2].m_symList;
      uVar1 = *(uint *)&local_30->field_0x44;
      *(ushort *)&local_30->field_0x44 =
           ((ushort)uVar1 & 0xfff7) + (ushort)(((ulong)pSVar3 & 0x600000000) != 0) * 8;
      if (local_30->m_count < 1) {
        uVar10 = 0;
      }
      else {
        uVar10 = 0x10;
        if (((uVar1 & 0x10) == 0) && (((ulong)pSVar3 & 0x600000000) == 0)) {
          bVar5 = FuncInfo::IsGlobalFunction((FuncInfo *)scope);
          uVar10 = (ushort)bVar5 << 4;
        }
      }
      *(ushort *)&pSVar4->field_0x44 = uVar10 | (ushort)*(undefined4 *)&pSVar4->field_0x44 & 0xffef;
      handler.scope = &local_30;
      handler.funcInfo = (FuncInfo **)&scope;
      handler.this = this;
      Parser::MapBindIdentifier<ByteCodeGenerator::StartEmitCatch(ParseNodeCatch*)::__0>
                (patternNode,handler);
    }
    else {
      pPVar9 = ParseNode::AsParseNodeName(this_00);
      pSVar4 = local_30;
      pSVar3 = pPVar9->sym;
      bVar6 = 1;
      if (((ulong)scope[2].m_symList & 0x600000000) == 0) {
        bVar6 = (pSVar3->field_0x42 & 0x10) >> 4;
      }
      *(ushort *)&local_30->field_0x44 =
           ((ushort)*(undefined4 *)&local_30->field_0x44 & 0xfff7) + (ushort)bVar6 * 8;
      uVar10 = 0x10;
      if (bVar6 == 0) {
        bVar5 = FuncInfo::IsGlobalFunction((FuncInfo *)scope);
        uVar10 = (ushort)bVar5 << 4;
      }
      *(ushort *)&pSVar4->field_0x44 = uVar10 | (ushort)*(undefined4 *)&pSVar4->field_0x44 & 0xffef;
      bVar5 = FuncInfo::IsGlobalFunction((FuncInfo *)scope);
      if (bVar5) {
        pSVar3->field_0x43 = pSVar3->field_0x43 | 2;
      }
      if ((pSVar3->field_0x44 & 0x40) != 0) {
        Scope::SetIsObject(local_30);
      }
      if ((local_30->field_0x44 & 0x10) != 0) {
        bVar5 = Symbol::IsInSlot(pSVar3,this,(FuncInfo *)scope,false);
        if (bVar5) {
          ProcessCapturedSym(this,pSVar3);
          Symbol::EnsureScopeSlot(pSVar3,this,(FuncInfo *)scope);
        }
      }
    }
  }
  PushScope(this,local_30);
  return;
}

Assistant:

void ByteCodeGenerator::StartEmitCatch(ParseNodeCatch *pnodeCatch)
{
    Assert(pnodeCatch->nop == knopCatch);

    Scope *scope = pnodeCatch->scope;
    FuncInfo *funcInfo = scope->GetFunc();

    // Catch scope is a dynamic object if it can be passed to a scoped lookup helper (i.e., eval is present or we're in an event handler).
    if (funcInfo->GetCallsEval() || funcInfo->GetChildCallsEval() || (this->flags & (fscrEval | fscrImplicitThis)))
    {
        scope->SetIsObject();
    }

    if (pnodeCatch->HasPatternParam())
    {
        ParseNode *pnode1 = pnodeCatch->GetParam()->AsParseNodeParamPattern()->pnode1;
        scope->SetCapturesAll(funcInfo->GetCallsEval() || funcInfo->GetChildCallsEval());
        scope->SetMustInstantiate(scope->Count() > 0 && (scope->GetMustInstantiate() || scope->GetCapturesAll() || funcInfo->IsGlobalFunction()));

        Parser::MapBindIdentifier(pnode1, [&](ParseNodePtr item)
        {
            Symbol *sym = item->AsParseNodeVar()->sym;
            if (funcInfo->IsGlobalFunction())
            {
                sym->SetIsGlobalCatch(true);
            }

            if (sym->NeedsScopeObject())
            {
                scope->SetIsObject();
            }

            Assert(sym->GetScopeSlot() == Js::Constants::NoProperty);
            if (sym->NeedsSlotAlloc(this, funcInfo))
            {
                sym->EnsureScopeSlot(this, funcInfo);
            }
        });
    }
    else if (pnodeCatch->HasParam())
    {
        Symbol *sym = pnodeCatch->GetParam()->AsParseNodeName()->sym;

        // Catch object is stored in the catch scope if there may be an ambiguous lookup or a var declaration that hides it.
        scope->SetCapturesAll(funcInfo->GetCallsEval() || funcInfo->GetChildCallsEval() || sym->GetHasNonLocalReference());
        scope->SetMustInstantiate(scope->GetCapturesAll() || funcInfo->IsGlobalFunction());

        if (funcInfo->IsGlobalFunction())
        {
            sym->SetIsGlobalCatch(true);
        }

        if (sym->NeedsScopeObject())
        {
            scope->SetIsObject();
        }

        if (scope->GetMustInstantiate())
        {
            if (sym->IsInSlot(this, funcInfo))
            {
                // Since there is only one symbol we are pushing to slot.
                // Also in order to make IsInSlot to return true - forcing the sym-has-non-local-reference.
                this->ProcessCapturedSym(sym);
                sym->EnsureScopeSlot(this, funcInfo);
            }
        }
    }

    PushScope(scope);
}